

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_parser.cc
# Opt level: O3

Response * __thiscall
iqxmlrpc::ResponseBuilder::get(Response *__return_storage_ptr__,ResponseBuilder *this)

{
  Value *this_00;
  XML_RPC_violation *this_01;
  string local_40;
  
  if ((this->ok_).super_type.m_initialized == true) {
    this_00 = (Value *)operator_new(0x10);
    Value::Value(this_00,(Value *)&(this->ok_).super_type.m_storage);
    Response::Response(__return_storage_ptr__,this_00);
  }
  else {
    if ((this->fault_str_).super_type.m_initialized != true) {
      this_01 = (XML_RPC_violation *)__cxa_allocate_exception(0x18);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"No valid response was found","");
      XML_RPC_violation::XML_RPC_violation(this_01,&local_40);
      __cxa_throw(this_01,&XML_RPC_violation::typeinfo,std::runtime_error::~runtime_error);
    }
    Response::Response(__return_storage_ptr__,this->fault_code_,
                       (string *)&(this->fault_str_).super_type.m_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

Response
ResponseBuilder::get()
{
  if (ok_)
    return Response(new Value(ok_.get()));

  if (fault_str_)
    return Response(fault_code_, fault_str_.get());

  throw XML_RPC_violation("No valid response was found");
}